

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

optional<pbrt::BilinearIntersection>
pbrt::IntersectBilinearPatch
          (Ray *ray,Float tMax,Point3f *p00,Point3f *p10,Point3f *p01,Point3f *p11)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  Point3f *extraout_RDX;
  float *in_R9;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 in_register_00001204 [60];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  float fVar34;
  undefined1 auVar35 [16];
  float fVar36;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  optional<pbrt::BilinearIntersection> oVar42;
  undefined1 extraout_var [60];
  
  auVar32._4_60_ = in_register_00001204;
  auVar32._0_4_ = tMax;
  fVar31 = (p01->super_Tuple3<pbrt::Point3,_float>).x;
  fVar34 = (p01->super_Tuple3<pbrt::Point3,_float>).y;
  fVar38 = (p10->super_Tuple3<pbrt::Point3,_float>).x;
  fVar36 = (p10->super_Tuple3<pbrt::Point3,_float>).y;
  fVar3 = fVar31 - fVar38;
  fVar4 = fVar34 - fVar36;
  fVar39 = (p01->super_Tuple3<pbrt::Point3,_float>).z;
  fVar40 = (p10->super_Tuple3<pbrt::Point3,_float>).z;
  fVar5 = fVar39 - fVar40;
  fVar1 = (p11->super_Tuple3<pbrt::Point3,_float>).x;
  fVar2 = (p11->super_Tuple3<pbrt::Point3,_float>).y;
  fVar6 = fVar1 - *in_R9;
  fVar7 = fVar2 - in_R9[1];
  auVar21 = ZEXT416((uint)(p11->super_Tuple3<pbrt::Point3,_float>).z);
  auVar12 = vsubss_avx512f(auVar21,ZEXT416((uint)in_R9[2]));
  auVar13 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar7));
  auVar14 = vfmsub213ss_avx512f(auVar12,ZEXT416((uint)fVar4),auVar13);
  auVar13 = vfnmadd231ss_avx512f(auVar13,ZEXT416((uint)fVar5),ZEXT416((uint)fVar7));
  auVar13 = vaddss_avx512f(auVar13,auVar14);
  auVar14 = vmulss_avx512f(ZEXT416((uint)fVar3),auVar12);
  auVar15 = vfmsub213ss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar6),auVar14);
  auVar12 = vfnmadd213ss_avx512f(auVar12,ZEXT416((uint)fVar3),auVar14);
  auVar12 = vaddss_avx512f(auVar15,auVar12);
  auVar14 = vmulss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)fVar6));
  auVar15 = vfmsub213ss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)fVar3),auVar14);
  auVar14 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)fVar4),auVar14);
  auVar16 = vsubss_avx512f(ZEXT416((uint)*in_R9),ZEXT416((uint)fVar31));
  auVar17 = vsubss_avx512f(ZEXT416((uint)in_R9[1]),ZEXT416((uint)fVar34));
  auVar18 = vsubss_avx512f(ZEXT416((uint)in_R9[2]),ZEXT416((uint)fVar39));
  auVar19 = vsubss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar38));
  auVar20 = vsubss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar36));
  auVar21 = vsubss_avx512f(auVar21,ZEXT416((uint)fVar40));
  auVar25 = ZEXT416((uint)(p00->super_Tuple3<pbrt::Point3,_float>).x);
  auVar22 = vsubss_avx512f(ZEXT416((uint)fVar38),auVar25);
  auVar26 = ZEXT416((uint)(p00->super_Tuple3<pbrt::Point3,_float>).y);
  auVar23 = vsubss_avx512f(ZEXT416((uint)fVar36),auVar26);
  auVar27 = ZEXT416((uint)(p00->super_Tuple3<pbrt::Point3,_float>).z);
  auVar24 = vsubss_avx512f(ZEXT416((uint)fVar40),auVar27);
  auVar25 = vsubss_avx512f(ZEXT416((uint)fVar31),auVar25);
  auVar26 = vsubss_avx512f(ZEXT416((uint)fVar34),auVar26);
  auVar27 = vsubss_avx512f(ZEXT416((uint)fVar39),auVar27);
  fVar31 = p00[1].super_Tuple3<pbrt::Point3,_float>.x;
  fVar34 = p00[1].super_Tuple3<pbrt::Point3,_float>.y;
  auVar12 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar12._0_4_ * fVar34)),ZEXT416((uint)fVar31),
                                auVar13);
  fVar38 = p00[1].super_Tuple3<pbrt::Point3,_float>.z;
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar38),
                            ZEXT416((uint)(auVar14._0_4_ + auVar15._0_4_)));
  fVar40 = auVar12._0_4_;
  auVar35 = ZEXT416((uint)fVar34);
  auVar12 = vmulss_avx512f(auVar24,auVar35);
  auVar13 = vfmsub213ss_avx512f(ZEXT416((uint)fVar38),auVar23,auVar12);
  auVar12 = vfnmadd231ss_avx512f(auVar12,auVar24,auVar35);
  auVar37 = ZEXT416((uint)fVar38);
  auVar14 = vmulss_avx512f(auVar22,auVar37);
  auVar15 = vfmsub213ss_avx512f(ZEXT416((uint)fVar31),auVar24,auVar14);
  auVar14 = vfnmadd231ss_avx512f(auVar14,auVar22,auVar37);
  auVar30 = ZEXT416((uint)fVar31);
  auVar28 = vmulss_avx512f(auVar23,auVar30);
  auVar29 = vfmsub213ss_avx512f(auVar35,auVar22,auVar28);
  auVar28 = vfnmadd231ss_avx512f(auVar28,auVar23,auVar30);
  auVar14 = vmulss_avx512f(auVar20,ZEXT416((uint)(auVar15._0_4_ + auVar14._0_4_)));
  auVar12 = vfmadd231ss_avx512f(auVar14,auVar19,ZEXT416((uint)(auVar13._0_4_ + auVar12._0_4_)));
  auVar14 = vfmadd231ss_avx512f(auVar12,auVar21,ZEXT416((uint)(auVar29._0_4_ + auVar28._0_4_)));
  auVar12 = vmulss_avx512f(auVar27,auVar35);
  auVar13 = vfmsub213ss_avx512f(auVar37,auVar26,auVar12);
  auVar12 = vfnmadd231ss_avx512f(auVar12,auVar27,ZEXT416((uint)fVar34));
  auVar15 = vmulss_avx512f(auVar25,auVar37);
  auVar28 = vfmsub213ss_avx512f(auVar30,auVar27,auVar15);
  auVar15 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar38),auVar25,auVar15);
  auVar29 = vmulss_avx512f(auVar26,auVar30);
  auVar30 = vfmsub213ss_avx512f(ZEXT416((uint)fVar34),auVar25,auVar29);
  auVar29 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar31),auVar26,auVar29);
  auVar15 = vmulss_avx512f(auVar17,ZEXT416((uint)(auVar28._0_4_ + auVar15._0_4_)));
  auVar12 = vfmadd231ss_avx512f(auVar15,auVar16,ZEXT416((uint)(auVar13._0_4_ + auVar12._0_4_)));
  auVar12 = vfmadd231ss_avx512f(auVar12,auVar18,ZEXT416((uint)(auVar30._0_4_ + auVar29._0_4_)));
  fVar39 = auVar14._0_4_;
  fVar38 = auVar12._0_4_ - (fVar40 + fVar39);
  fVar34 = fVar40 * 4.0 * fVar39;
  auVar12 = vfmsub213ss_fma(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38),ZEXT416((uint)fVar34));
  fVar36 = auVar12._0_4_;
  auVar12 = vfnmadd213ss_fma(ZEXT416((uint)(fVar40 * 4.0)),auVar14,ZEXT416((uint)fVar34));
  fVar31 = auVar12._0_4_ + fVar36;
  auVar13 = ZEXT416((uint)fVar34);
  if (0.0 <= fVar31) {
    if (fVar31 < 0.0) {
      auVar33._0_4_ = sqrtf(fVar31);
      auVar33._4_60_ = extraout_var;
      auVar12 = auVar33._0_16_;
      auVar25 = ZEXT416(auVar25._0_4_);
      auVar24 = ZEXT416(auVar24._0_4_);
      auVar26 = ZEXT416(auVar26._0_4_);
      auVar23 = ZEXT416(auVar23._0_4_);
      auVar22 = ZEXT416(auVar22._0_4_);
      auVar27 = ZEXT416(auVar27._0_4_);
      auVar21 = ZEXT416(auVar21._0_4_);
      auVar20 = ZEXT416(auVar20._0_4_);
      auVar19 = ZEXT416(auVar19._0_4_);
      auVar16 = ZEXT416(auVar16._0_4_);
      auVar17 = ZEXT416(auVar17._0_4_);
      auVar18 = ZEXT416(auVar18._0_4_);
      p10 = extraout_RDX;
    }
    else {
      auVar12 = vsqrtss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31));
    }
    if ((fVar40 != 0.0) || (NAN(fVar40))) {
      auVar15._8_4_ = 0x7fffffff;
      auVar15._0_8_ = 0x7fffffff7fffffff;
      auVar15._12_4_ = 0x7fffffff;
      auVar12 = vpternlogd_avx512vl(auVar12,ZEXT416((uint)fVar38),auVar15,0xe4);
      fVar34 = (fVar38 + auVar12._0_4_) * -0.5;
      fVar36 = fVar34 / fVar40;
      auVar12 = ZEXT416((uint)fVar36);
      auVar28._0_4_ = fVar39 / fVar34;
      auVar28._4_12_ = auVar14._4_12_;
      auVar13 = auVar28;
      if (auVar28._0_4_ < fVar36) {
        auVar13 = auVar12;
        auVar12 = auVar28;
      }
    }
    else {
      auVar12._8_4_ = 0x80000000;
      auVar12._0_8_ = 0x8000000080000000;
      auVar12._12_4_ = 0x80000000;
      auVar12 = vxorps_avx512vl(auVar14,auVar12);
      auVar13._0_4_ = auVar12._0_4_ / fVar38;
      auVar13._4_12_ = auVar12._4_12_;
      auVar12 = auVar13;
    }
  }
  if (0.0 <= fVar31) {
    fVar31 = auVar12._0_4_;
    if ((0.0 <= fVar31) && (fVar31 <= 1.0)) {
      fVar34 = 1.0 - fVar31;
      auVar14 = vmulss_avx512f(auVar22,ZEXT416((uint)fVar34));
      auVar15 = vmulss_avx512f(auVar23,ZEXT416((uint)fVar34));
      auVar30 = ZEXT416((uint)fVar34);
      auVar28 = vmulss_avx512f(auVar24,auVar30);
      auVar29 = vmulss_avx512f(auVar25,auVar12);
      fVar39 = auVar29._0_4_ + auVar14._0_4_;
      auVar14 = vmulss_avx512f(auVar26,auVar12);
      fVar40 = auVar14._0_4_ + auVar15._0_4_;
      auVar14 = vmulss_avx512f(auVar27,auVar12);
      fVar1 = auVar14._0_4_ + auVar28._0_4_;
      auVar14 = vmulss_avx512f(auVar19,auVar30);
      auVar15 = vmulss_avx512f(auVar20,auVar30);
      auVar28 = vmulss_avx512f(auVar21,auVar30);
      auVar29 = vmulss_avx512f(auVar16,auVar12);
      fVar2 = auVar29._0_4_ + auVar14._0_4_;
      auVar14 = vmulss_avx512f(auVar17,auVar12);
      fVar3 = auVar14._0_4_ + auVar15._0_4_;
      auVar14 = vmulss_avx512f(auVar18,auVar12);
      fVar4 = auVar14._0_4_ + auVar28._0_4_;
      fVar34 = p00[1].super_Tuple3<pbrt::Point3,_float>.x;
      fVar38 = p00[1].super_Tuple3<pbrt::Point3,_float>.y;
      fVar36 = p00[1].super_Tuple3<pbrt::Point3,_float>.z;
      auVar15 = ZEXT416((uint)(fVar3 * fVar36));
      auVar14 = vfmsub213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar38),auVar15);
      auVar41 = ZEXT416((uint)fVar36);
      auVar15 = vfnmadd231ss_fma(auVar15,auVar41,ZEXT416((uint)fVar3));
      fVar36 = auVar14._0_4_ + auVar15._0_4_;
      auVar15 = ZEXT416((uint)(fVar34 * fVar4));
      auVar14 = vfmsub213ss_fma(ZEXT416((uint)fVar2),auVar41,auVar15);
      auVar37 = ZEXT416((uint)fVar34);
      auVar15 = vfnmadd231ss_fma(auVar15,auVar37,ZEXT416((uint)fVar4));
      fVar34 = auVar14._0_4_ + auVar15._0_4_;
      auVar14 = vfmsub213ss_fma(ZEXT416((uint)fVar3),auVar37,ZEXT416((uint)(fVar38 * fVar2)));
      auVar15 = vfnmadd231ss_fma(ZEXT416((uint)(fVar38 * fVar2)),ZEXT416((uint)fVar38),
                                 ZEXT416((uint)fVar2));
      fVar5 = auVar15._0_4_ + auVar14._0_4_;
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar34)),ZEXT416((uint)fVar36),
                                ZEXT416((uint)fVar36));
      auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
      auVar35 = ZEXT416((uint)fVar5);
      auVar15 = vmulss_avx512f(ZEXT416((uint)fVar40),auVar35);
      auVar28 = vfmsub213ss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar34),auVar15);
      auVar15 = vfnmadd231ss_avx512f(auVar15,auVar35,ZEXT416((uint)fVar40));
      auVar29 = vaddss_avx512f(auVar28,auVar15);
      auVar30 = ZEXT416((uint)fVar36);
      auVar15 = vmulss_avx512f(ZEXT416((uint)fVar1),auVar30);
      auVar28 = vfmsub213ss_avx512f(auVar35,ZEXT416((uint)fVar39),auVar15);
      auVar15 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar1),auVar30,auVar15);
      fVar36 = auVar28._0_4_ + auVar15._0_4_;
      auVar15 = vfmsub213ss_fma(ZEXT416((uint)fVar40),auVar30,ZEXT416((uint)(fVar34 * fVar39)));
      auVar28 = vfnmadd213ss_fma(ZEXT416((uint)fVar39),ZEXT416((uint)fVar34),
                                 ZEXT416((uint)(fVar34 * fVar39)));
      auVar30 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar3 * fVar36)),auVar29,ZEXT416((uint)fVar2));
      auVar35 = ZEXT416((uint)(auVar15._0_4_ + auVar28._0_4_));
      auVar15 = vfmadd231ss_fma(auVar30,auVar35,ZEXT416((uint)fVar4));
      auVar28 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar38 * fVar36)),auVar29,auVar37);
      auVar28 = vfmadd231ss_fma(auVar28,auVar35,auVar41);
      fVar36 = auVar28._0_4_ / auVar14._0_4_;
      uVar8 = vcmpss_avx512f(ZEXT816(0),auVar28,6);
      bVar11 = (bool)((byte)uVar8 & 1);
      uVar8 = vcmpss_avx512f(ZEXT816(0),auVar15,5);
      bVar9 = (bool)((byte)uVar8 & 1);
      uVar8 = vcmpss_avx512f(auVar28,auVar14,6);
      bVar10 = (bool)((byte)uVar8 & 1);
      tMax = (Float)((uint)bVar10 * (int)tMax +
                    (uint)!bVar10 *
                    ((uint)bVar9 * (int)tMax +
                    (uint)!bVar9 *
                    ((uint)bVar11 * (int)tMax + (uint)!bVar11 * (int)(auVar15._0_4_ / auVar14._0_4_)
                    )));
    }
    fVar34 = auVar13._0_4_;
    bVar11 = fVar34 < 0.0;
    if ((!bVar11) && (bVar11 = 1.0 < fVar34, !bVar11)) {
      bVar11 = fVar34 < fVar31;
      if ((fVar34 != fVar31) || (NAN(fVar34) || NAN(fVar31))) {
        fVar34 = 1.0 - fVar34;
        auVar14 = vmulss_avx512f(auVar22,ZEXT416((uint)fVar34));
        auVar15 = vmulss_avx512f(auVar23,ZEXT416((uint)fVar34));
        auVar28 = ZEXT416((uint)fVar34);
        auVar22 = vmulss_avx512f(auVar24,auVar28);
        auVar23 = vmulss_avx512f(auVar25,auVar13);
        fVar39 = auVar23._0_4_ + auVar14._0_4_;
        auVar14 = vmulss_avx512f(auVar26,auVar13);
        fVar40 = auVar14._0_4_ + auVar15._0_4_;
        auVar14 = vmulss_avx512f(auVar27,auVar13);
        fVar1 = auVar14._0_4_ + auVar22._0_4_;
        auVar14 = vmulss_avx512f(auVar19,auVar28);
        auVar15 = vmulss_avx512f(auVar20,auVar28);
        auVar19 = vmulss_avx512f(auVar21,auVar28);
        auVar16 = vmulss_avx512f(auVar16,auVar13);
        fVar2 = auVar16._0_4_ + auVar14._0_4_;
        auVar14 = vmulss_avx512f(auVar17,auVar13);
        fVar3 = auVar14._0_4_ + auVar15._0_4_;
        auVar14 = vmulss_avx512f(auVar18,auVar13);
        fVar4 = auVar14._0_4_ + auVar19._0_4_;
        fVar31 = p00[1].super_Tuple3<pbrt::Point3,_float>.x;
        fVar34 = p00[1].super_Tuple3<pbrt::Point3,_float>.y;
        fVar38 = p00[1].super_Tuple3<pbrt::Point3,_float>.z;
        auVar15 = vmulss_avx512f(ZEXT416((uint)fVar3),ZEXT416((uint)fVar38));
        auVar14 = vfmsub213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar34),auVar15);
        auVar15 = vfnmadd231ss_avx512f(auVar15,ZEXT416((uint)fVar38),ZEXT416((uint)fVar3));
        fVar5 = auVar14._0_4_ + auVar15._0_4_;
        auVar14 = ZEXT416((uint)(fVar31 * fVar4));
        auVar15 = vfmsub213ss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar38),auVar14);
        auVar21 = ZEXT416((uint)fVar31);
        auVar14 = vfnmadd231ss_fma(auVar14,auVar21,ZEXT416((uint)fVar4));
        fVar31 = auVar15._0_4_ + auVar14._0_4_;
        auVar14 = vfmsub213ss_fma(ZEXT416((uint)fVar3),auVar21,ZEXT416((uint)(fVar34 * fVar2)));
        auVar15 = vfnmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar2)),ZEXT416((uint)fVar34),
                                   ZEXT416((uint)fVar2));
        fVar6 = auVar14._0_4_ + auVar15._0_4_;
        auVar14 = ZEXT416((uint)(fVar40 * fVar6));
        auVar15 = vfmsub213ss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar31),auVar14);
        auVar19 = ZEXT416((uint)fVar6);
        auVar14 = vfnmadd231ss_fma(auVar14,auVar19,ZEXT416((uint)fVar40));
        auVar15 = vaddss_avx512f(auVar15,auVar14);
        auVar14 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar5));
        auVar16 = vfmsub213ss_avx512f(ZEXT416((uint)fVar39),auVar19,auVar14);
        auVar14 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar5),auVar14);
        auVar16 = vaddss_avx512f(auVar16,auVar14);
        auVar14 = vmulss_avx512f(ZEXT416((uint)fVar39),ZEXT416((uint)fVar31));
        auVar20 = ZEXT416((uint)fVar5);
        auVar17 = vfmsub213ss_avx512f(ZEXT416((uint)fVar40),auVar20,auVar14);
        auVar18 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar39),ZEXT416((uint)fVar31),auVar14);
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * auVar16._0_4_)),auVar15,auVar21);
        auVar17 = ZEXT416((uint)(auVar17._0_4_ + auVar18._0_4_));
        auVar14 = vfmadd231ss_avx512f(auVar14,auVar17,ZEXT416((uint)fVar38));
        fVar34 = auVar14._0_4_;
        bVar11 = fVar34 < 0.0;
        if (!bVar11) {
          auVar14 = vfmadd213ss_fma(auVar20,auVar20,ZEXT416((uint)(fVar31 * fVar31)));
          auVar14 = vfmadd213ss_fma(auVar19,auVar19,auVar14);
          fVar31 = auVar14._0_4_;
          bVar11 = fVar31 < fVar34;
          if (!bVar11) {
            auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar15,
                                      ZEXT416((uint)(auVar16._0_4_ * fVar3)));
            auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar17,auVar14);
            fVar38 = auVar14._0_4_ / fVar31;
            bVar11 = tMax < fVar38;
            if ((fVar38 < tMax) && (bVar11 = fVar38 < 0.0, 0.0 < fVar38)) {
              fVar36 = fVar34 / fVar31;
              auVar12 = auVar13;
            }
          }
        }
      }
    }
    auVar13 = vucomiss_avx512f(auVar32._0_16_);
    if (bVar11) {
      *(undefined1 *)&(ray->d).super_Tuple3<pbrt::Vector3,_float>.x = 1;
      (ray->o).super_Tuple3<pbrt::Point3,_float>.x = auVar12._0_4_;
      (ray->o).super_Tuple3<pbrt::Point3,_float>.y = fVar36;
      (ray->o).super_Tuple3<pbrt::Point3,_float>.z = auVar13._0_4_;
      goto LAB_0025115f;
    }
  }
  (ray->o).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (ray->o).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(ray->o).super_Tuple3<pbrt::Point3,_float>.z = 0;
LAB_0025115f:
  oVar42._8_8_ = p10;
  oVar42.optionalValue._0_8_ = ray;
  return oVar42;
}

Assistant:

PBRT_CPU_GPU inline pstd::optional<BilinearIntersection> IntersectBilinearPatch(
    const Ray &ray, Float tMax, const Point3f &p00, const Point3f &p10,
    const Point3f &p01, const Point3f &p11) {
    // Find quadratic coefficients for distance from ray to $u$ line
    Vector3f qn = Cross(p10 - p00, p01 - p11);
    Vector3f e11 = p11 - p10, e00 = p01 - p00;
    Vector3f q00 = p00 - ray.o, q10 = p10 - ray.o;
    Float a = Dot(qn, ray.d);
    Float c = Dot(Cross(q00, ray.d), e00);
    Float b = Dot(Cross(q10, ray.d), e11) - (a + c);

    // Solve quadratic for bilinear patch intersection
    Float u1, u2;
    if (!Quadratic(a, b, c, &u1, &u2))
        return {};

    Float t = tMax, u, v;
    // Compute $(u,v)$ and ray $t$ corresponding to first quadratic root
    if (0 <= u1 && u1 <= 1) {
        Vector3f pa = Lerp(u1, q00, q10), pb = Lerp(u1, e00, e11);
        Vector3f n = Cross(ray.d, pb);
        Float det = Dot(n, n);
        n = Cross(n, pa);
        Float t1 = Dot(n, pb), v1 = Dot(n, ray.d);
        // Set _u_, _v_, and _t_ if intersection is valid
        if (t1 > 0 && 0 <= v1 && v1 <= det) {
            u = u1;
            v = v1 / det;
            t = t1 / det;
        }
    }

    // Compute $(u,v)$ and ray $t$ corresponding to second quadratic root
    if (0 <= u2 && u2 <= 1 && u2 != u1) {
        Vector3f pa = Lerp(u2, q00, q10), pb = Lerp(u2, e00, e11);
        Vector3f n = Cross(ray.d, pb);
        Float det = Dot(n, n);
        n = Cross(n, pa);
        Float t2 = Dot(n, pb) / det;
        Float v2 = Dot(n, ray.d);
        if (0 <= v2 && v2 <= det && t > t2 && t2 > 0) {
            t = t2;
            u = u2;
            v = v2 / det;
        }
    }

    // TODO: reject hits with sufficiently small t that we're not sure.
    // Check intersection $t$ against _tMax_ and possibly return intersection
    if (t >= tMax)
        return {};
    return BilinearIntersection{{u, v}, t};
}